

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall
mjs::literal_expression::literal_expression(literal_expression *this,source_extend *extend,token *t)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint32_t uVar3;
  
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001de120;
  (this->super_expression).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_expression).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  uVar3 = extend->end;
  (this->super_expression).super_syntax_node.extend_.start = extend->start;
  (this->super_expression).super_syntax_node.extend_.end = uVar3;
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__literal_expression_001dea28;
  token::token(&this->t_,t);
  uVar1 = t->type_ - false_;
  if (((0x21 < uVar1) || ((0x200040001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (1 < t->type_ - numeric_literal)) {
    __assert_fail("is_literal(t.type())",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0xc0,
                  "mjs::literal_expression::literal_expression(const source_extend &, const token &)"
                 );
  }
  return;
}

Assistant:

explicit literal_expression(const source_extend& extend, const token& t) : expression(extend), t_(t) {
        assert(is_literal(t.type()));
    }